

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::PerformAction<bool()>
          (Action<bool_()> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<bool> *pAVar2;
  
  pAVar2 = (ActionResultHolder<bool> *)operator_new(0x10);
  RVar1 = Action<bool_()>::Perform(action);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001e4218;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }